

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall
CTPNMember::gen_code_asi
          (CTPNMember *this,int discard,int phase,tc_asitype_t typ,char *op,CTcPrsNode *rhs,
          int ignore_errors,int param_7,void **ctx)

{
  int iVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  CTcGenTarg *pCVar4;
  short sVar5;
  int *piVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  undefined8 uVar8;
  undefined7 uVar11;
  ulong uVar9;
  size_t sVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  uint unaff_EBP;
  uchar opc;
  uint local_3c;
  int is_self;
  int local_34;
  
  uVar8 = CONCAT44(in_register_0000000c,typ);
  local_34 = discard;
  if (phase == 2) {
    piVar6 = (int *)*ctx;
    is_self = *piVar6;
    unaff_EBP = piVar6[1];
    local_3c = (uint)*(ushort *)(piVar6 + 2);
    operator_delete(piVar6,0xc);
  }
  else {
    local_3c = (uint)ctx;
  }
  uVar11 = (undefined7)((ulong)uVar8 >> 8);
  if (rhs != (CTcPrsNode *)0x0 && typ == TC_ASI_SIMPLE) {
    (**(rhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(rhs,0,0);
  }
  uVar9 = CONCAT71(uVar11,local_34 != 0);
  if ((phase == 2 || typ == TC_ASI_SIMPLE) && local_34 == 0) {
    CTcGenTarg::write_op(G_cg,0x88);
    pCVar4 = G_cg;
    iVar1 = G_cg->sp_depth_;
    uVar7 = iVar1 + 1;
    uVar9 = (ulong)uVar7;
    G_cg->sp_depth_ = uVar7;
    if (pCVar4->max_sp_depth_ <= iVar1) {
      pCVar4->max_sp_depth_ = uVar7;
    }
  }
  sVar10 = CONCAT71((int7)(uVar9 >> 8),phase != 1);
  if (phase != 1 && typ != TC_ASI_SIMPLE) goto LAB_0021080a;
  pCVar3 = (this->super_CTPNMemberBase).obj_expr_;
  unaff_EBP = (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x18])(pCVar3,&is_self);
  uVar9 = (ulong)unaff_EBP;
  pCVar3 = (this->super_CTPNMemberBase).prop_expr_;
  local_3c = (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                       (pCVar3,1,(ulong)((byte)(this->super_CTPNMemberBase).field_0x18 & 1));
  sVar10 = (size_t)(uint)is_self;
  sVar5 = (short)local_3c;
  if (sVar5 == 0) {
    if (is_self == 0) {
      if (unaff_EBP != 0) {
        CTcGenTarg::write_op(G_cg,'\a');
        CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,uVar9);
        goto LAB_002106fe;
      }
    }
    else {
      CTcGenTarg::write_op(G_cg,0x84);
LAB_002106fe:
      pCVar4 = G_cg;
      iVar1 = G_cg->sp_depth_;
      uVar7 = iVar1 + 1;
      sVar10 = (size_t)uVar7;
      G_cg->sp_depth_ = uVar7;
      if (pCVar4->max_sp_depth_ <= iVar1) {
        pCVar4->max_sp_depth_ = uVar7;
      }
    }
    pCVar3 = (this->super_CTPNMemberBase).prop_expr_;
    (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
              (pCVar3,0,(ulong)((byte)(this->super_CTPNMemberBase).field_0x18 & 1));
    if (typ == TC_ASI_SIMPLE) {
      local_3c = 0;
      goto LAB_0021080a;
    }
    CTcGenTarg::write_op(G_cg,0x8f);
    pCVar4 = G_cg;
    uVar7 = G_cg->sp_depth_ + 2;
    sVar10 = (size_t)uVar7;
    G_cg->sp_depth_ = uVar7;
    if (pCVar4->max_sp_depth_ < (int)uVar7) {
      pCVar4->max_sp_depth_ = uVar7;
    }
  }
  else if ((typ != TC_ASI_SIMPLE) &&
          (sVar10 = (size_t)(is_self | unaff_EBP), (is_self | unaff_EBP) == 0)) {
    CTcGenTarg::write_op(G_cg,0x88);
    pCVar4 = G_cg;
    iVar1 = G_cg->sp_depth_;
    uVar7 = iVar1 + 1;
    sVar10 = (size_t)uVar7;
    G_cg->sp_depth_ = uVar7;
    uVar9 = 0;
    if (pCVar4->max_sp_depth_ <= iVar1) {
      pCVar4->max_sp_depth_ = uVar7;
      uVar9 = 0;
    }
  }
  unaff_EBP = (uint)uVar9;
  sVar10 = CONCAT71((int7)(sVar10 >> 8),phase != 1);
  if (typ == TC_ASI_SIMPLE || phase != 1) {
LAB_0021080a:
    if (phase == 2 || typ == TC_ASI_SIMPLE) {
      if ((short)local_3c == 0) {
        sVar10 = CONCAT71((int7)(sVar10 >> 8),phase != 2);
        if (typ != TC_ASI_SIMPLE && phase == 2) {
          if (local_34 == 0) {
            opc = 'z';
          }
          else {
            CTcGenTarg::write_op(G_cg,'{');
            CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf_00,sVar10);
            CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf_01,sVar10);
            opc = 0x8d;
          }
          CTcGenTarg::write_op(G_cg,opc);
        }
        CTcGenTarg::write_op(G_cg,0xe6);
        G_cg->sp_depth_ = G_cg->sp_depth_ + -3;
      }
      else {
        if (((phase == 2) && (is_self == 0)) && (unaff_EBP == 0)) {
          if (local_34 == 0) {
            CTcGenTarg::write_op(G_cg,'{');
            CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf_02,sVar10);
            CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf_03,sVar10);
          }
          else {
            CTcGenTarg::write_op(G_cg,0x8d);
          }
        }
        if (is_self == 0) {
          if (unaff_EBP == 0) {
            CTcGenTarg::write_op(G_cg,0xe5);
            CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,local_3c & 0xffff);
            G_cg->sp_depth_ = G_cg->sp_depth_ + -2;
            return 1;
          }
          CTcGenTarg::write_op(G_cg,0xe8);
          CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,(ulong)unaff_EBP);
        }
        else {
          CTcGenTarg::write_op(G_cg,0xe7);
        }
        CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,local_3c & 0xffff);
        G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
      }
    }
    return 1;
  }
  piVar6 = (int *)operator_new(0xc);
  sVar10 = (size_t)(uint)is_self;
  *piVar6 = is_self;
  piVar6[1] = unaff_EBP;
  *(short *)(piVar6 + 2) = sVar5;
  *ctx = piVar6;
  if (sVar5 == 0) {
    CTcGenTarg::write_op(G_cg,'b');
    CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf,sVar10);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -2;
  }
  else {
    if (is_self == 0) {
      if (unaff_EBP == 0) {
        CTcGenTarg::write_op(G_cg,'`');
        CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,local_3c & 0xffff);
        G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
        goto LAB_002108f0;
      }
      CTcGenTarg::write_op(G_cg,'f');
      CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,uVar9);
    }
    else {
      CTcGenTarg::write_op(G_cg,'c');
    }
    CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,local_3c & 0xffff);
  }
LAB_002108f0:
  CTcGenTarg::write_op(G_cg,0x8b);
  pCVar4 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (iVar2 < pCVar4->max_sp_depth_) {
    return 0;
  }
  pCVar4->max_sp_depth_ = iVar1;
  return 0;
}

Assistant:

int CTPNMember::gen_code_asi(int discard, int phase,
                             tc_asitype_t typ, const char *op,
                             CTcPrsNode *rhs,
                             int ignore_errors, int, void **ctx)
{
    int is_self;
    vm_obj_id_t obj;
    vm_prop_id_t prop;

    /* if this is phase 2 of a compound assignment, retrieve the context */
    if (phase == 2)
    {
        /* cast the generic context pointer to our structure */
        member_ca_ctx *cctx = (member_ca_ctx *)*ctx;

        /* retrieve the context information */
        is_self = cctx->is_self;
        obj = cctx->obj;
        prop = cctx->prop;

        /* we're done with the context object - delete it */
        delete cctx;
    }

    /* 
     *   if this is a simple assignment, start by generating the right-hand
     *   side, unless the caller has already done so 
     */
    if (typ == TC_ASI_SIMPLE && rhs != 0)
        rhs->gen_code(FALSE, FALSE);

    /* 
     *   If this is a simple assignment, or it's phase 2 of a two-phase
     *   assignment, we now have the RHS at top of stack, and we're about to
     *   perform the actual assignment.  If the caller wants to further use
     *   the assigned value, push a copy, since we'll consume the RHS value
     *   currently on the stack with our SETPROP or related instruction. 
     */
    if (!discard && (typ == TC_ASI_SIMPLE || phase == 2))
    {
        G_cg->write_op(OPC_DUP);
        G_cg->note_push();
    }

    /*
     *   If this is a simple assignment, or phase 1 of a two-phase compound
     *   assignment, generate the object and property expressions. 
     */
    if (typ == TC_ASI_SIMPLE || phase == 1)
    {
        /* 
         *   Determine what we have on the left: we could have self, a
         *   constant object value, or any other expression.  
         */
        obj = get_obj_expr()->gen_code_obj_predot(&is_self);
        
        /* 
         *   determine what kind of property expression we have - don't
         *   generate any code for now, since we may need to generate some
         *   more code ahead of the property generation 
         */
        prop = get_prop_expr()->gen_code_propid(TRUE, prop_is_expr_);
        
        /* determine what we need to do based on the operands */
        if (prop == VM_INVALID_PROP)
        {
            /* 
             *   We're assigning through a property pointer -- we must
             *   generate a PTRSETPROP instruction.
             *   
             *   Before we generate the property expression, we must generate
             *   the object expression.  If we got a constant object, we must
             *   generate code to push that object value; otherwise, the code
             *   to generate the object value is already generated.  
             */
            if (is_self)
            {
                /* self - generate code to push the "self" value */
                G_cg->write_op(OPC_PUSHSELF);
                G_cg->note_push();
            }
            else if (obj != VM_INVALID_OBJ)
            {
                /* constant object - generate code to push the value */
                G_cg->write_op(OPC_PUSHOBJ);
                G_cs->write_obj_id(obj);
                G_cg->note_push();
            }

            /* generate the property value expression */
            get_prop_expr()->gen_code_propid(FALSE, prop_is_expr_);
            
            /*
             *   If this is phase 1 of a two-phase compound assignment, we'll
             *   need the object and property values that we've just stacked
             *   again in phase 2.  Save separate copies via DUP2.  
             */
            if (typ != TC_ASI_SIMPLE)
            {
                G_cg->write_op(OPC_DUP2);
                G_cg->note_push(2);
            }
        }
        else
        {
            /* 
             *   We're assigning to a fixed property ID.  If the object
             *   expression was not 'self' or a fixed object ID, we have an
             *   object value on the stack; otherwise we have nothing on the
             *   stack.
             *   
             *   For a two-phase assignment, we'll need the object value
             *   again during the second phase, so if we did indeed stack a
             *   value, make a copy of it for our use in phase 2.  
             */
            if (typ != TC_ASI_SIMPLE && !is_self && obj == VM_INVALID_OBJ)
            {
                G_cg->write_op(OPC_DUP);
                G_cg->note_push();
            }
        }
    }

    /*
     *   If this is phase 1 of a two-phase assignment, stop here: we've
     *   stacked the necessary obj and prop information for the actual
     *   assignment codegen in phase 2, and we've stacked the obj.prop value
     *   for the combination operator to access.  Save context information
     *   and return, telling the caller to proceed with the unrolled
     *   operation.  
     */
    if (typ != TC_ASI_SIMPLE && phase == 1)
    {
        /* save the object and property information in the phase context */
        *ctx = new member_ca_ctx(is_self, obj, prop);

        /* evaluate the property */
        if (prop == VM_INVALID_PROP)
        {
            /* property pointer - call with zero arguments */
            G_cg->write_op(OPC_PTRCALLPROP);
            G_cs->write(0);

            /* this pops the object and property */
            G_cg->note_pop(2);
        }
        else
        {
            /* constant property */
            if (is_self)
            {
                /* get property of self */
                G_cg->write_op(OPC_GETPROPSELF);
                G_cs->write_prop_id(prop);
            }
            else if (obj != VM_INVALID_OBJ)
            {
                /* constant object */
                G_cg->write_op(OPC_OBJGETPROP);
                G_cs->write_obj_id(obj);
                G_cs->write_prop_id(prop);
            }
            else
            {
                /* it's an object expression */
                G_cg->write_op(OPC_GETPROP);
                G_cs->write_prop_id(prop);

                /* this pops the object value */
                G_cg->note_pop();
            }
        }

        /* all of these leave the value in R0 - retrieve it */
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();

        /* tell the caller to proceed with the unrolled assignment */
        return FALSE;
    }

    /*
     *   If we're doing a simple assignment, or this is phase 2 of a compound
     *   assignment, it's time to do the actual assignment. 
     */
    if (typ == TC_ASI_SIMPLE || phase == 2)
    {
        /* determine how to make the assignment based on the operands */
        if (prop == VM_INVALID_PROP)
        {
            /*
             *   If this is phase 2 of a compound assignment, get the stack
             *   back in order.  We currently have (from bottom to top) obj
             *   prop RHS RHS (if !discard), or obj prop RHS (if discard).
             *   Swap the top one or two elements for the next two.  
             */
            if (typ != TC_ASI_SIMPLE && phase == 2)
            {
                if (discard)
                {
                    /* obj prop RHS -> RHS prop obj */
                    G_cg->write_op(OPC_SWAPN);
                    G_cs->write(0);
                    G_cs->write(2);
                    
                    /* RHS prop obj -> RHS obj prop */
                    G_cg->write_op(OPC_SWAP);
                }
                else
                {
                    /* obj prop RHS RHS -> RHS RHS obj prop */
                    G_cg->write_op(OPC_SWAP2);
                }
            }
                
            /* generate the PTRSETPROP instruction */
            G_cg->write_op(OPC_PTRSETPROP);

            /* ptrsetprop removes three elements */
            G_cg->note_pop(3);
        }
        else
        {
            /* constant property value */

            /* 
             *   If this is phase 2, and we have an object on the stack, we
             *   need to rearrange the stack into the proper order:
             *   
             *   !discard: stack = (obj RHS RHS), and we need (RHS RHS obj).
             *   
             *   discard: stack = (obj RHS), and we need (obj RHS).  Just do
             *   a SWAP.
             *   
             *   If there's no object on the stack, there's no need to do any
             *   rearrangement.  
             */
            if (phase == 2 && !is_self && obj == VM_INVALID_OBJ)
            {
                if (discard)
                {
                    /* obj RHS -> RHS obj */
                    G_cg->write_op(OPC_SWAP);
                }
                else
                {
                    /* obj RHS RHS -> RHS RHS obj */
                    G_cg->write_op(OPC_SWAPN);
                    G_cs->write(0);
                    G_cs->write(2);
                }
            }

            /* 
             *   We have several instructions to choose from.  If we're
             *   assigning to a property of "self", use SETPROPSELF.  If
             *   we're assigning to a constant object, use OBJSETPROP.
             *   Otherwise, use the plain SETPROP.
             */
            if (is_self)
            {
                /* write the SETPROPSELF */
                G_cg->write_op(OPC_SETPROPSELF);
                G_cs->write_prop_id(prop);

                /* setpropself removes the RHS value */
                G_cg->note_pop();
            }
            else if (obj != VM_INVALID_OBJ)
            {
                /* write the OBJSETPROP */
                G_cg->write_op(OPC_OBJSETPROP);
                G_cs->write_obj_id(obj);
                G_cs->write_prop_id(prop);

                /* objsetprop removes the RHS value */
                G_cg->note_pop();
            }
            else
            {
                /* 
                 *   write the normal SETPROP; we already generated the code
                 *   to push the object value, so it's where it should be 
                 */
                G_cg->write_op(OPC_SETPROP);
                G_cs->write_prop_id(prop);
                
                /* setprop removes the value and the object */
                G_cg->note_pop(2);
            }
        }
    }

    /* we're done with the operation */
    return TRUE;
}